

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_modified(AMQP_VALUE value,MODIFIED_HANDLE *modified_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  AMQP_VALUE local_50;
  fields message_annotations;
  _Bool undeliverable_here;
  AMQP_VALUE pAStack_40;
  _Bool delivery_failed;
  AMQP_VALUE item_value;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  MODIFIED_INSTANCE *modified_instance;
  MODIFIED_HANDLE *ppMStack_18;
  int result;
  MODIFIED_HANDLE *modified_handle_local;
  AMQP_VALUE value_local;
  
  ppMStack_18 = modified_handle;
  modified_handle_local = (MODIFIED_HANDLE *)value;
  list_value = (AMQP_VALUE)modified_create_internal();
  *ppMStack_18 = (MODIFIED_HANDLE)list_value;
  if (*ppMStack_18 == (MODIFIED_HANDLE)0x0) {
    modified_instance._4_4_ = 0x46e5;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)modified_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      modified_destroy(*ppMStack_18);
      modified_instance._4_4_ = 0x46ed;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,(uint32_t *)((long)&item_value + 4));
      if (iVar1 == 0) {
        if ((item_value._4_4_ != 0) &&
           (pAStack_40 = amqpvalue_get_list_item(pAStack_30,0), pAStack_40 != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(pAStack_40);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_boolean(pAStack_40,(_Bool *)((long)&message_annotations + 7)),
             iVar1 != 0)) {
            amqpvalue_destroy(pAStack_40);
            modified_destroy(*ppMStack_18);
            return 0x4710;
          }
          amqpvalue_destroy(pAStack_40);
        }
        if ((1 < item_value._4_4_) &&
           (pAStack_40 = amqpvalue_get_list_item(pAStack_30,1), pAStack_40 != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(pAStack_40);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_boolean(pAStack_40,(_Bool *)((long)&message_annotations + 6)),
             iVar1 != 0)) {
            amqpvalue_destroy(pAStack_40);
            modified_destroy(*ppMStack_18);
            return 0x472d;
          }
          amqpvalue_destroy(pAStack_40);
        }
        if ((2 < item_value._4_4_) &&
           (pAStack_40 = amqpvalue_get_list_item(pAStack_30,2), pAStack_40 != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(pAStack_40);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_map(pAStack_40,&local_50), iVar1 != 0)) {
            amqpvalue_destroy(pAStack_40);
            modified_destroy(*ppMStack_18);
            return 0x474a;
          }
          amqpvalue_destroy(pAStack_40);
        }
        pAVar3 = amqpvalue_clone((AMQP_VALUE)modified_handle_local);
        *(AMQP_VALUE *)list_value = pAVar3;
        modified_instance._4_4_ = 0;
      }
      else {
        modified_instance._4_4_ = 0x46f4;
      }
    }
  }
  return modified_instance._4_4_;
}

Assistant:

int amqpvalue_get_modified(AMQP_VALUE value, MODIFIED_HANDLE* modified_handle)
{
    int result;
    MODIFIED_INSTANCE* modified_instance = (MODIFIED_INSTANCE*)modified_create_internal();
    *modified_handle = modified_instance;
    if (*modified_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            modified_destroy(*modified_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* delivery-failed */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool delivery_failed;
                                if (amqpvalue_get_boolean(item_value, &delivery_failed) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    modified_destroy(*modified_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* undeliverable-here */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool undeliverable_here;
                                if (amqpvalue_get_boolean(item_value, &undeliverable_here) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    modified_destroy(*modified_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* message-annotations */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                fields message_annotations;
                                if (amqpvalue_get_fields(item_value, &message_annotations) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    modified_destroy(*modified_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    modified_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}